

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleNotifications
          (ChainImpl *this,shared_ptr<interfaces::Chain::Notifications> *notifications)

{
  unique_ptr<node::(anonymous_namespace)::NotificationsHandlerImpl,_std::default_delete<node::(anonymous_namespace)::NotificationsHandlerImpl>_>
  *in_RDX;
  _Head_base<0UL,_interfaces::Handler_*,_false> in_RDI;
  long in_FS_OFFSET;
  ValidationSignals *unaff_retaddr;
  _Head_base<0UL,_interfaces::Handler_*,_false> this_00;
  shared_ptr<interfaces::Chain::Notifications> *__args_1;
  
  __args_1 = *(shared_ptr<interfaces::Chain::Notifications> **)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = in_RDI._M_head_impl;
  validation_signals((ChainImpl *)in_RDI._M_head_impl);
  std::
  make_unique<node::(anonymous_namespace)::NotificationsHandlerImpl,ValidationSignals&,std::shared_ptr<interfaces::Chain::Notifications>>
            (unaff_retaddr,__args_1);
  std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>::
  unique_ptr<node::(anonymous_namespace)::NotificationsHandlerImpl,std::default_delete<node::(anonymous_namespace)::NotificationsHandlerImpl>,void>
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             this_00._M_head_impl,in_RDX);
  std::
  unique_ptr<node::(anonymous_namespace)::NotificationsHandlerImpl,_std::default_delete<node::(anonymous_namespace)::NotificationsHandlerImpl>_>
  ::~unique_ptr((unique_ptr<node::(anonymous_namespace)::NotificationsHandlerImpl,_std::default_delete<node::(anonymous_namespace)::NotificationsHandlerImpl>_>
                 *)this_00._M_head_impl);
  if (*(shared_ptr<interfaces::Chain::Notifications> **)(in_FS_OFFSET + 0x28) == __args_1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleNotifications(std::shared_ptr<Notifications> notifications) override
    {
        return std::make_unique<NotificationsHandlerImpl>(validation_signals(), std::move(notifications));
    }